

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.h
# Opt level: O2

SnapArrayInfo<double> *
TTD::NSSnapObjects::ExtractArrayValues<double>(JavascriptArray *arrayObject,SlabAllocator *alloc)

{
  uint lastIndex;
  BOOL BVar1;
  uint32 index;
  SnapArrayInfoBlock<double> *pSVar2;
  SnapArrayInfoBlock<double> *pSVar3;
  SnapArrayInfoBlock<double> *pSVar4;
  SnapArrayInfo<double> *pSVar5;
  uint32 uVar6;
  uint32 i;
  ulong uVar7;
  long lVar8;
  
  lastIndex = (arrayObject->super_ArrayObject).length;
  if ((ulong)lastIndex == 0) {
    pSVar2 = (SnapArrayInfoBlock<double> *)0x0;
  }
  else if (lastIndex < 0x101) {
    lVar8 = 0;
    pSVar2 = AllocateArrayInfoBlock<double,false>(alloc,0,lastIndex);
    for (uVar7 = 0; lastIndex != uVar7; uVar7 = uVar7 + 1) {
      BVar1 = Js::JavascriptArray::DirectGetItemAt<double>
                        (arrayObject,(uint32)uVar7,
                         (double *)((long)pSVar2->ArrayRangeContents + lVar8));
      pSVar2->ArrayValidTags[uVar7] = (byte)BVar1;
      lVar8 = lVar8 + 8;
    }
  }
  else {
    index = 0xffffffff;
    pSVar4 = (SnapArrayInfoBlock<double> *)0x0;
    pSVar2 = (SnapArrayInfoBlock<double> *)0x0;
    while (index = Js::JavascriptArray::GetNextIndex(arrayObject,index), index != 0xffffffff) {
      pSVar3 = pSVar4;
      if (pSVar2 == (SnapArrayInfoBlock<double> *)0x0) {
        uVar6 = index + 0x200;
        if (0xfffffdff < index) {
          uVar6 = 0xffffffff;
        }
        pSVar3 = AllocateArrayInfoBlock<double,true>(alloc,index,uVar6);
        pSVar2 = pSVar3;
      }
      if (pSVar3 == (SnapArrayInfoBlock<double> *)0x0) {
        TTDAbort_unrecoverable_error("Should get set with variable sai above when needed!");
      }
      pSVar4 = pSVar3;
      if (pSVar3->LastIndex <= index) {
        uVar6 = index + 0x200;
        if (0xfffffdff < index) {
          uVar6 = 0xffffffff;
        }
        pSVar4 = AllocateArrayInfoBlock<double,true>(alloc,index,uVar6);
        pSVar3->Next = pSVar4;
      }
      pSVar4->ArrayValidTags[index - pSVar4->FirstIndex] = '\x01';
      Js::JavascriptArray::DirectGetItemAt<double>
                (arrayObject,index,pSVar4->ArrayRangeContents + (index - pSVar4->FirstIndex));
    }
  }
  pSVar5 = (SnapArrayInfo<double> *)SlabAllocatorBase<0>::SlabAllocateTypeRawSize<16ul>(alloc);
  pSVar5->Length = (arrayObject->super_ArrayObject).length;
  pSVar5->Data = pSVar2;
  return pSVar5;
}

Assistant:

SnapArrayInfo<T>* ExtractArrayValues(Js::JavascriptArray* arrayObject, SlabAllocator& alloc)
        {
            SnapArrayInfoBlock<T>* sai = nullptr;

            uint32 length = arrayObject->GetLength();
            if(length == 0)
            {
                ; //just leave it as a null ptr
            }
            else if(length <= TTD_ARRAY_SMALL_ARRAY)
            {
                sai = AllocateArrayInfoBlock<T, false>(alloc, 0, length);
                for(uint32 i = 0; i < length; ++i)
                {
                    sai->ArrayValidTags[i] = (byte)arrayObject->DirectGetItemAt<T>(i, sai->ArrayRangeContents + i);
                }
            }
            else
            {
                SnapArrayInfoBlock<T>* curr = nullptr;
                for(uint32 idx = arrayObject->GetNextIndex(Js::JavascriptArray::InvalidIndex); idx != Js::JavascriptArray::InvalidIndex; idx = arrayObject->GetNextIndex(idx))
                {
                    if(sai == nullptr)
                    {
                        uint32 endIdx = (idx <= (Js::JavascriptArray::MaxArrayLength - TTD_ARRAY_BLOCK_SIZE)) ? (idx + TTD_ARRAY_BLOCK_SIZE) : Js::JavascriptArray::MaxArrayLength;
                        sai = AllocateArrayInfoBlock<T, true>(alloc, idx, endIdx);
                        curr = sai;
                    }

                    TTDAssert(curr != nullptr, "Should get set with variable sai above when needed!");
                    if(idx >= curr->LastIndex)
                    {
                        uint32 endIdx = (idx <= (Js::JavascriptArray::MaxArrayLength - TTD_ARRAY_BLOCK_SIZE)) ? (idx + TTD_ARRAY_BLOCK_SIZE) : Js::JavascriptArray::MaxArrayLength;
                        curr->Next = AllocateArrayInfoBlock<T, true>(alloc, idx, endIdx);
                        curr = curr->Next;
                    }

                    curr->ArrayValidTags[idx - curr->FirstIndex] = TRUE;
                    arrayObject->DirectGetItemAt<T>(idx, curr->ArrayRangeContents + (idx - curr->FirstIndex));
                }
            }

            SnapArrayInfo<T>* res = alloc.SlabAllocateStruct< SnapArrayInfo<T> >();
            res->Length = arrayObject->GetLength();
            res->Data = sai;

            return res;
        }